

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetSuffledPicturePaths.h
# Opt level: O1

bool GetShuffledPicturePaths::isImageFile(string *str)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *supportedExtension;
  pointer pbVar5;
  long *plVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string imagePath;
  allocator_type local_99;
  pointer local_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  toLowerCase(&local_50,str);
  if (isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&isImageFile(std::__cxx11::string_const&)::
                                 supportedImageExtensions_abi_cxx11_);
    if (iVar3 != 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".jpg","");
      plVar6 = local_60;
      local_70[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,".png","");
      __l._M_len = 2;
      __l._M_array = &local_90;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,__l,
               &local_99);
      lVar4 = -0x40;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isImageFile(std::__cxx11::string_const&)::
                           supportedImageExtensions_abi_cxx11_);
    }
  }
  local_98 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar7) {
    pbVar5 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      toLowerCase(&local_90,str);
      lVar4 = std::__cxx11::string::find((char *)&local_90,(ulong)(pbVar5->_M_dataplus)._M_p,0);
      sVar1 = str->_M_string_length;
      sVar2 = pbVar5->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (lVar4 == sVar1 - sVar2) break;
      pbVar5 = pbVar5 + 1;
      bVar7 = pbVar5 != local_98;
    } while (bVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool isImageFile(const std::string& str)
    {
        std::string imagePath = toLowerCase(str);

        static const std::vector<std::string> supportedImageExtensions = {".jpg", ".png"};
        for(const auto& supportedExtension : supportedImageExtensions) {
            if (toLowerCase(str).find(supportedExtension) == str.size() - supportedExtension.size()){
                return true;
            }
        }
        return false;
    }